

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O2

void DirectoryCommit(path *dirname)

{
  long lVar1;
  int __fd;
  FILE *__stream;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = fsbridge::fopen((char *)dirname,"r");
  if (__stream == (FILE *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return;
    }
  }
  else {
    __fd = fileno(__stream);
    fsync(__fd);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      fclose(__stream);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void DirectoryCommit(const fs::path& dirname)
{
#ifndef WIN32
    FILE* file = fsbridge::fopen(dirname, "r");
    if (file) {
        fsync(fileno(file));
        fclose(file);
    }
#endif
}